

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

void sptk::world::cftbsub(int n,double *a,int *ip,int nw,double *w)

{
  double dVar1;
  double dVar2;
  
  if (n < 9) {
    if (n == 4) {
      dVar1 = *a;
      dVar2 = a[1];
      *a = dVar1 + a[2];
      a[1] = dVar2 + a[3];
      a[2] = dVar1 - a[2];
      a[3] = dVar2 - a[3];
    }
    else if (n == 8) {
      cftb040(a);
      return;
    }
    return;
  }
  if (0x20 < n) {
    cftb1st(n,a,w + (int)(nw - ((uint)n >> 2)));
    if (n < 0x201) {
      if (n < 0x81) {
        cftfx41(n,a,nw,w);
      }
      else {
        cftleaf(n,1,a,nw,w);
      }
    }
    else {
      cftrec4(n,a,nw,w);
    }
    bitrv2conj(n,ip,a);
    return;
  }
  if (n == 0x20) {
    cftf161(a,w + (long)nw + -8);
    bitrv216neg(a);
    return;
  }
  cftf081(a,w);
  bitrv208neg(a);
  return;
}

Assistant:

void cftbsub(int n, double *a, int *ip, int nw, double *w) {
#if 0
  void bitrv2conj(int n, int *ip, double *a);
  void bitrv216neg(double *a);
  void bitrv208neg(double *a);
  void cftb1st(int n, double *a, double *w);
  void cftrec4(int n, double *a, int nw, double *w);
  void cftleaf(int n, int isplt, double *a, int nw, double *w);
  void cftfx41(int n, double *a, int nw, double *w);
  void cftf161(double *a, double *w);
  void cftf081(double *a, double *w);
  void cftb040(double *a);
  void cftx020(double *a);
#endif

  if (n > 8) {
    if (n > 32) {
      cftb1st(n, a, &w[nw - (n >> 2)]);
      if (n > 512) {
        cftrec4(n, a, nw, w);
      } else if (n > 128) {
        cftleaf(n, 1, a, nw, w);
      } else {
        cftfx41(n, a, nw, w);
      }
      bitrv2conj(n, ip, a);
    } else if (n == 32) {
      cftf161(a, &w[nw - 8]);
      bitrv216neg(a);
    } else {
      cftf081(a, w);
      bitrv208neg(a);
    }
  } else if (n == 8) {
    cftb040(a);
  } else if (n == 4) {
    cftx020(a);
  }
}